

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int fs_storage_path(char *appname,char *path,int max)

{
  long lVar1;
  int buffer_size;
  int iVar2;
  char *__s;
  char *pcVar3;
  size_t sVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char **ppcVar7;
  char cVar8;
  char *buffer;
  long in_FS_OFFSET;
  undefined8 uStack_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  stat sb;
  
  sb.__glibc_reserved[2] = *(__syscall_slong_t *)(in_FS_OFFSET + 0x28);
  uStack_f0 = 0x1d00d5;
  local_d8 = path;
  __s = getenv("HOME");
  uStack_f0 = 0x1d00e4;
  pcVar3 = getenv("XDG_DATA_HOME");
  pcVar6 = local_d8;
  lVar1 = -((ulong)(uint)max + 0xf & 0xfffffffffffffff0);
  buffer = (char *)((long)&local_e8 + lVar1);
  for (ppcVar7 = &local_e8; (long)buffer < (long)ppcVar7; ppcVar7 = ppcVar7 + -0x200) {
    *ppcVar7 = *ppcVar7;
  }
  if (__s == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    local_e8 = pcVar3;
    local_e0 = appname;
    local_cc = max;
    *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d014a;
    str_format(pcVar6,max,"%s/.%s",__s,appname);
    *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d0152;
    sVar4 = strlen(__s);
    iVar2 = (int)sVar4 + 2;
    cVar8 = pcVar6[iVar2];
    if (cVar8 != '\0') {
      *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d0166;
      pp_Var5 = __ctype_tolower_loc();
      pcVar6 = local_d8 + iVar2;
      do {
        *pcVar6 = (char)(*pp_Var5)[cVar8];
        cVar8 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      } while (cVar8 != '\0');
    }
    buffer_size = local_cc;
    pcVar3 = local_e0;
    pcVar6 = local_e8;
    if (local_e8 == (char *)0x0) {
      *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d0228;
      str_format(buffer,buffer_size,"%s/.local/share/%s",__s,pcVar3);
      *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d0230;
      sVar4 = strlen(__s);
      iVar2 = (int)sVar4 + 0xe;
      cVar8 = buffer[iVar2];
      if (cVar8 != '\0') {
        *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d0243;
        pp_Var5 = __ctype_tolower_loc();
        pcVar6 = buffer + iVar2;
        do {
          *pcVar6 = (char)(*pp_Var5)[cVar8];
          cVar8 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        } while (cVar8 != '\0');
      }
    }
    else {
      *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d01bc;
      str_format(buffer,buffer_size,"%s/%s",pcVar6,pcVar3);
      *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d01c4;
      sVar4 = strlen(pcVar6);
      iVar2 = (int)sVar4 + 1;
      cVar8 = buffer[iVar2];
      if (cVar8 != '\0') {
        *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d01da;
        pp_Var5 = __ctype_tolower_loc();
        pcVar6 = buffer + iVar2;
        do {
          *pcVar6 = (char)(*pp_Var5)[cVar8];
          cVar8 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        } while (cVar8 != '\0');
      }
    }
    pcVar6 = local_d8;
    *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d0273;
    iVar2 = stat(pcVar6,(stat *)local_c8);
    pcVar6 = local_d8;
    if ((iVar2 == -1) || (iVar2 = 0, ((uint)sb.st_nlink & 0xf000) != 0x4000)) {
      iVar2 = 0;
      *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1d02a9;
      str_format(pcVar6,buffer_size,"%s",buffer);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != sb.__glibc_reserved[2]) {
    *(code **)((long)&uStack_f0 + lVar1) = fs_makedir;
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int fs_storage_path(const char *appname, char *path, int max)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR *home = _wgetenv(L"APPDATA");
	char buffer[IO_MAX_PATH_LENGTH];
	if(!home)
		return -1;
	WideCharToMultiByte(CP_UTF8, 0, home, -1, buffer, sizeof(buffer), NULL, NULL);
	str_format(path, max, "%s/%s", buffer, appname);
	return 0;
#else
	char *home = getenv("HOME");
	int i;
	char *xdgdatahome = getenv("XDG_DATA_HOME");
	char xdgpath[max];

	if(!home)
		return -1;

#if defined(CONF_PLATFORM_MACOSX)
	str_format(path, max, "%s/Library/Application Support/%s", home, appname);
	return 0;
#endif

	/* old folder location */
	str_format(path, max, "%s/.%s", home, appname);
	for(i = str_length(home)+2; path[i]; i++)
		path[i] = tolower(path[i]);

	if(!xdgdatahome)
	{
		/* use default location */
		str_format(xdgpath, max, "%s/.local/share/%s", home, appname);
		for(i = str_length(home)+14; xdgpath[i]; i++)
			xdgpath[i] = tolower(xdgpath[i]);
	}
	else
	{
		str_format(xdgpath, max, "%s/%s", xdgdatahome, appname);
		for(i = str_length(xdgdatahome)+1; xdgpath[i]; i++)
			xdgpath[i] = tolower(xdgpath[i]);
	}

	/* check for old location / backward compatibility */
	if(fs_is_dir(path))
	{
		/* use old folder path */
		/* for backward compatibility */
		return 0;
	}

	str_format(path, max, "%s", xdgpath);

	return 0;
#endif
}